

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt1.cpp
# Opt level: O0

bool __thiscall
crnlib::dxt1_endpoint_optimizer::try_average_block_as_solid(dxt1_endpoint_optimizer *this)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  uint uVar4;
  bool bVar5;
  uint uVar6;
  unique_color *puVar7;
  byte *pbVar8;
  dxt1_solution_coordinates local_78;
  dxt1_solution_coordinates local_74;
  uint local_70;
  uint local_6c;
  uint high_color_1;
  uint low_color_1;
  uint b;
  uint g;
  uint r;
  uint i_1;
  bool local_4d;
  uint local_4c;
  uint uStack_48;
  bool improved;
  uint high_color;
  uint low_color;
  uint ave_b;
  uint ave_g;
  uint ave_r;
  uint half_total_weight;
  uint weight;
  uint i;
  uint total_weight;
  uint64 tot_b;
  uint64 tot_g;
  uint64 tot_r;
  dxt1_endpoint_optimizer *this_local;
  
  tot_g = 0;
  tot_b = 0;
  _i = 0;
  weight = 0;
  tot_r = (uint64)this;
  for (half_total_weight = 0; uVar4 = half_total_weight,
      uVar6 = vector<crnlib::unique_color>::size(&this->m_unique_colors), uVar4 < uVar6;
      half_total_weight = half_total_weight + 1) {
    puVar7 = vector<crnlib::unique_color>::operator[](&this->m_unique_colors,half_total_weight);
    ave_r = puVar7->m_weight;
    weight = ave_r + weight;
    puVar7 = vector<crnlib::unique_color>::operator[](&this->m_unique_colors,half_total_weight);
    tot_g = (ulong)(puVar7->m_color).field_0.field_0.r * (ulong)ave_r + tot_g;
    puVar7 = vector<crnlib::unique_color>::operator[](&this->m_unique_colors,half_total_weight);
    tot_b = (ulong)(puVar7->m_color).field_0.field_0.g * (ulong)ave_r + tot_b;
    puVar7 = vector<crnlib::unique_color>::operator[](&this->m_unique_colors,half_total_weight);
    _i = (ulong)(puVar7->m_color).field_0.field_0.b * (ulong)ave_r + _i;
  }
  ave_g = weight >> 1;
  uVar1 = (tot_g + ave_g) / (ulong)weight;
  ave_b = (uint)uVar1;
  uVar2 = (tot_b + ave_g) / (ulong)weight;
  low_color = (uint)uVar2;
  uVar3 = (_i + (ulong)ave_g) / (ulong)weight;
  high_color = (uint)uVar3;
  uStack_48 = (uint)(byte)ryg_dxt::OMatch5[(uVar1 & 0xffffffff) * 2] << 0xb |
              (uint)(byte)ryg_dxt::OMatch6[(uVar2 & 0xffffffff) * 2] << 5 |
              (uint)(byte)ryg_dxt::OMatch5[(uVar3 & 0xffffffff) * 2];
  local_4c = (uint)(byte)ryg_dxt::OMatch5[(uVar1 & 0xffffffff) * 2 + 1] << 0xb |
             (uint)(byte)ryg_dxt::OMatch6[(uVar2 & 0xffffffff) * 2 + 1] << 5 |
             (uint)(byte)ryg_dxt::OMatch5[(uVar3 & 0xffffffff) * 2 + 1];
  dxt1_solution_coordinates::dxt1_solution_coordinates
            ((dxt1_solution_coordinates *)((long)&i_1 + 2),(uint16)uStack_48,(uint16)local_4c);
  local_4d = evaluate_solution(this,(dxt1_solution_coordinates *)((long)&i_1 + 2),false);
  if (((this->m_pParams->m_use_alpha_blocks & 1U) != 0) && ((this->m_best_solution).m_error != 0)) {
    uStack_48 = (uint)(byte)ryg_dxt::OMatch5_3[(ulong)ave_b * 2] << 0xb |
                (uint)(byte)ryg_dxt::OMatch6_3[(ulong)low_color * 2] << 5 |
                (uint)(byte)ryg_dxt::OMatch5_3[(ulong)high_color * 2];
    local_4c = (uint)(byte)ryg_dxt::OMatch5_3[(ulong)ave_b * 2 + 1] << 0xb |
               (uint)(byte)ryg_dxt::OMatch6_3[(ulong)low_color * 2 + 1] << 5 |
               (uint)(byte)ryg_dxt::OMatch5_3[(ulong)high_color * 2 + 1];
    dxt1_solution_coordinates::dxt1_solution_coordinates
              ((dxt1_solution_coordinates *)((long)&r + 2),(uint16)uStack_48,(uint16)local_4c);
    bVar5 = evaluate_solution(this,(dxt1_solution_coordinates *)((long)&r + 2),false);
    local_4d = (local_4d & 1U) != 0 || bVar5;
  }
  if (this->m_pParams->m_quality == cCRNDXTQualityUber) {
    for (g = 0; uVar4 = g, uVar6 = vector<crnlib::unique_color>::size(&this->m_unique_colors),
        uVar4 < uVar6; g = g + 1) {
      puVar7 = vector<crnlib::unique_color>::operator[](&this->m_unique_colors,g);
      pbVar8 = color_quad<unsigned_char,_int>::operator[](&puVar7->m_color,0);
      b = (uint)*pbVar8;
      puVar7 = vector<crnlib::unique_color>::operator[](&this->m_unique_colors,g);
      pbVar8 = color_quad<unsigned_char,_int>::operator[](&puVar7->m_color,1);
      low_color_1 = (uint)*pbVar8;
      puVar7 = vector<crnlib::unique_color>::operator[](&this->m_unique_colors,g);
      pbVar8 = color_quad<unsigned_char,_int>::operator[](&puVar7->m_color,2);
      high_color_1 = (uint)*pbVar8;
      if (((b != ave_b) || (low_color_1 != low_color)) || (high_color_1 != high_color)) {
        local_6c = (uint)(byte)ryg_dxt::OMatch5[(ulong)b * 2] << 0xb |
                   (uint)(byte)ryg_dxt::OMatch6[(ulong)low_color_1 * 2] << 5 |
                   (uint)(byte)ryg_dxt::OMatch5[(ulong)high_color_1 * 2];
        local_70 = (uint)(byte)ryg_dxt::OMatch5[(ulong)b * 2 + 1] << 0xb |
                   (uint)(byte)ryg_dxt::OMatch6[(ulong)low_color_1 * 2 + 1] << 5 |
                   (uint)(byte)ryg_dxt::OMatch5[(ulong)high_color_1 * 2 + 1];
        dxt1_solution_coordinates::dxt1_solution_coordinates
                  (&local_74,(uint16)local_6c,(uint16)local_70);
        bVar5 = evaluate_solution(this,&local_74,false);
        local_4d = (local_4d & 1U) != 0 || bVar5;
        if (((this->m_pParams->m_use_alpha_blocks & 1U) != 0) &&
           ((this->m_best_solution).m_error != 0)) {
          local_6c = (uint)(byte)ryg_dxt::OMatch5_3[(ulong)b * 2] << 0xb |
                     (uint)(byte)ryg_dxt::OMatch6_3[(ulong)low_color_1 * 2] << 5 |
                     (uint)(byte)ryg_dxt::OMatch5_3[(ulong)high_color_1 * 2];
          local_70 = (uint)(byte)ryg_dxt::OMatch5_3[(ulong)b * 2 + 1] << 0xb |
                     (uint)(byte)ryg_dxt::OMatch6_3[(ulong)low_color_1 * 2 + 1] << 5 |
                     (uint)(byte)ryg_dxt::OMatch5_3[(ulong)high_color_1 * 2 + 1];
          dxt1_solution_coordinates::dxt1_solution_coordinates
                    (&local_78,(uint16)local_6c,(uint16)local_70);
          bVar5 = evaluate_solution(this,&local_78,false);
          local_4d = (local_4d & 1U) != 0 || bVar5;
        }
      }
    }
  }
  return (bool)(local_4d & 1);
}

Assistant:

bool dxt1_endpoint_optimizer::try_average_block_as_solid() {
  uint64 tot_r = 0;
  uint64 tot_g = 0;
  uint64 tot_b = 0;

  uint total_weight = 0;
  for (uint i = 0; i < m_unique_colors.size(); i++) {
    uint weight = m_unique_colors[i].m_weight;
    total_weight += weight;

    tot_r += m_unique_colors[i].m_color.r * static_cast<uint64>(weight);
    tot_g += m_unique_colors[i].m_color.g * static_cast<uint64>(weight);
    tot_b += m_unique_colors[i].m_color.b * static_cast<uint64>(weight);
  }

  const uint half_total_weight = total_weight >> 1;
  uint ave_r = static_cast<uint>((tot_r + half_total_weight) / total_weight);
  uint ave_g = static_cast<uint>((tot_g + half_total_weight) / total_weight);
  uint ave_b = static_cast<uint>((tot_b + half_total_weight) / total_weight);

  uint low_color = (ryg_dxt::OMatch5[ave_r][0] << 11) | (ryg_dxt::OMatch6[ave_g][0] << 5) | ryg_dxt::OMatch5[ave_b][0];
  uint high_color = (ryg_dxt::OMatch5[ave_r][1] << 11) | (ryg_dxt::OMatch6[ave_g][1] << 5) | ryg_dxt::OMatch5[ave_b][1];
  bool improved = evaluate_solution(dxt1_solution_coordinates((uint16)low_color, (uint16)high_color));

  if ((m_pParams->m_use_alpha_blocks) && (m_best_solution.m_error)) {
    low_color = (ryg_dxt::OMatch5_3[ave_r][0] << 11) | (ryg_dxt::OMatch6_3[ave_g][0] << 5) | ryg_dxt::OMatch5_3[ave_b][0];
    high_color = (ryg_dxt::OMatch5_3[ave_r][1] << 11) | (ryg_dxt::OMatch6_3[ave_g][1] << 5) | ryg_dxt::OMatch5_3[ave_b][1];
    improved |= evaluate_solution(dxt1_solution_coordinates((uint16)low_color, (uint16)high_color));
  }

  if (m_pParams->m_quality == cCRNDXTQualityUber) {
    // Try compressing as all-solid using the other (non-average) colors in the block in uber.
    for (uint i = 0; i < m_unique_colors.size(); i++) {
      uint r = m_unique_colors[i].m_color[0];
      uint g = m_unique_colors[i].m_color[1];
      uint b = m_unique_colors[i].m_color[2];
      if ((r == ave_r) && (g == ave_g) && (b == ave_b))
        continue;

      uint low_color = (ryg_dxt::OMatch5[r][0] << 11) | (ryg_dxt::OMatch6[g][0] << 5) | ryg_dxt::OMatch5[b][0];
      uint high_color = (ryg_dxt::OMatch5[r][1] << 11) | (ryg_dxt::OMatch6[g][1] << 5) | ryg_dxt::OMatch5[b][1];
      improved |= evaluate_solution(dxt1_solution_coordinates((uint16)low_color, (uint16)high_color));

      if ((m_pParams->m_use_alpha_blocks) && (m_best_solution.m_error)) {
        low_color = (ryg_dxt::OMatch5_3[r][0] << 11) | (ryg_dxt::OMatch6_3[g][0] << 5) | ryg_dxt::OMatch5_3[b][0];
        high_color = (ryg_dxt::OMatch5_3[r][1] << 11) | (ryg_dxt::OMatch6_3[g][1] << 5) | ryg_dxt::OMatch5_3[b][1];
        improved |= evaluate_solution(dxt1_solution_coordinates((uint16)low_color, (uint16)high_color));
      }
    }
  }

  return improved;
}